

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

int decompose(int n,int *ifac,int *ntryh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  
  iVar3 = *ntryh;
  if (iVar3 == 0) {
    iVar2 = 0;
  }
  else {
    lVar7 = 0;
    lVar5 = 0;
    iVar1 = n;
    do {
      if (iVar1 == 1) {
        iVar1 = 1;
      }
      else {
        iVar2 = (int)lVar5;
        lVar5 = (long)iVar2;
        uVar4 = iVar2 + 2;
        piVar8 = ifac + lVar5 + 2;
        do {
          iVar2 = iVar1 / iVar3;
          if (iVar1 != iVar2 * iVar3) goto LAB_001063c2;
          ifac[lVar5 + 2] = iVar3;
          if ((iVar3 == 2) && (lVar5 != 0)) {
            if (0 < lVar5) {
              lVar6 = 0;
              do {
                piVar8[lVar6] = piVar8[lVar6 + -1];
                lVar6 = lVar6 + -1;
              } while (2 - (ulong)uVar4 != lVar6);
            }
            ifac[2] = 2;
          }
          lVar5 = lVar5 + 1;
          uVar4 = uVar4 + 1;
          piVar8 = piVar8 + 1;
          iVar1 = iVar2;
        } while (iVar2 != 1);
        iVar1 = 1;
      }
LAB_001063c2:
      iVar2 = (int)lVar5;
      iVar3 = ntryh[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (iVar3 != 0);
  }
  *ifac = n;
  ifac[1] = iVar2;
  return iVar2;
}

Assistant:

static int decompose(int n, int *ifac, const int *ntryh) {
  int nl = n, nf = 0, i, j = 0;
  for (j=0; ntryh[j]; ++j) {
    int ntry = ntryh[j];
    while (nl != 1) {
      int nq = nl / ntry;
      int nr = nl - ntry * nq;
      if (nr == 0) {
        ifac[2+nf++] = ntry;
        nl = nq;
        if (ntry == 2 && nf != 1) {
          for (i = 2; i <= nf; ++i) {
            int ib = nf - i + 2;
            ifac[ib + 1] = ifac[ib];
          }
          ifac[2] = 2;
        }
      } else break;
    }
  }
  ifac[0] = n;
  ifac[1] = nf;  
  return nf;
}